

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O3

IfcFloat Assimp::IFC::RecursiveSearch
                   (Curve *cv,IfcVector3 *val,IfcFloat a,IfcFloat b,uint samples,IfcFloat threshold,
                   uint recurse,uint max_recurse)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  IfcFloat IVar6;
  double extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  double dVar7;
  double dVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double local_98;
  double local_60;
  double local_58;
  double local_50;
  IfcFloat local_48;
  
  if (samples < 2) {
    __assert_fail("samples>1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x20e,
                  "IfcFloat Assimp::IFC::RecursiveSearch(const Curve *, const IfcVector3 &, IfcFloat, IfcFloat, unsigned int, IfcFloat, unsigned int, unsigned int)"
                 );
  }
  dVar11 = b - a;
  local_98 = INFINITY;
  dVar7 = INFINITY;
  uVar2 = samples;
  IVar6 = a;
  local_48 = a;
  do {
    (*cv->_vptr_Curve[3])(&local_60,cv);
    dVar8 = local_60 - val->x;
    dVar5 = local_58 - val->y;
    dVar4 = local_50 - val->z;
    dVar5 = dVar4 * dVar4 + dVar8 * dVar8 + dVar5 * dVar5;
    if (dVar7 <= dVar5) {
      uVar9 = SUB84(a,0);
      uVar10 = (undefined4)((ulong)a >> 0x20);
      dVar4 = dVar7;
      if (dVar5 < local_98) {
        b = IVar6;
        local_98 = dVar5;
      }
    }
    else {
      uVar9 = SUB84(IVar6,0);
      uVar10 = (undefined4)((ulong)IVar6 >> 0x20);
      dVar4 = dVar5;
      b = a;
      local_98 = dVar7;
    }
    a = (IfcFloat)CONCAT44(uVar10,uVar9);
    IVar6 = IVar6 + dVar11 / (double)samples;
    uVar2 = uVar2 - 1;
    dVar7 = dVar4;
  } while (uVar2 != 0);
  if (dVar4 < INFINITY) {
    if (local_98 < INFINITY) {
      if ((recurse < max_recurse) && (threshold <= ABS(local_48 - (double)CONCAT44(uVar10,uVar9))))
      {
        dVar7 = (double)CONCAT44(uVar10,uVar9);
        dVar11 = b;
        iVar1 = (*cv->_vptr_Curve[2])(cv);
        if ((char)iVar1 != '\0') {
          (*cv->_vptr_Curve[5])(cv);
          dVar11 = ABS(dVar11 - extraout_XMM0_Qa) * 0.5;
          if (dVar11 < ABS(dVar7 - b)) {
            (*cv->_vptr_Curve[5])(cv);
            (*cv->_vptr_Curve[3])(&local_60,cv);
            local_60 = local_60 - val->x;
            local_58 = local_58 - val->y;
            local_50 = local_50 - val->z;
            dVar5 = local_50 * local_50 + local_60 * local_60 + local_58 * local_58;
            uVar3 = -(ulong)(dVar5 < dVar4);
            dVar7 = (double)(~uVar3 & (ulong)dVar7 |
                            (~-(ulong)(dVar7 < b) & (ulong)dVar11 |
                            extraout_XMM0_Qa_00 & -(ulong)(dVar7 < b)) & uVar3);
            if (dVar4 <= dVar5) {
              uVar9 = SUB84(b,0);
              uVar10 = (undefined4)((ulong)b >> 0x20);
            }
            b = (IfcFloat)CONCAT44(uVar10,uVar9);
          }
        }
        IVar6 = RecursiveSearch(cv,val,dVar7,b,samples,threshold,recurse + 1,max_recurse);
        uVar9 = SUB84(IVar6,0);
        uVar10 = (undefined4)((ulong)IVar6 >> 0x20);
      }
      return (IfcFloat)CONCAT44(uVar10,uVar9);
    }
    __assert_fail("min_diff[ 1 ] != inf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x224,
                  "IfcFloat Assimp::IFC::RecursiveSearch(const Curve *, const IfcVector3 &, IfcFloat, IfcFloat, unsigned int, IfcFloat, unsigned int, unsigned int)"
                 );
  }
  __assert_fail("min_diff[ 0 ] != inf",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,0x223,
                "IfcFloat Assimp::IFC::RecursiveSearch(const Curve *, const IfcVector3 &, IfcFloat, IfcFloat, unsigned int, IfcFloat, unsigned int, unsigned int)"
               );
}

Assistant:

IfcFloat RecursiveSearch(const Curve* cv, const IfcVector3& val, IfcFloat a, IfcFloat b,
        unsigned int samples, IfcFloat threshold, unsigned int recurse = 0, unsigned int max_recurse = 15) {
    ai_assert(samples>1);

    const IfcFloat delta = (b-a)/samples, inf = std::numeric_limits<IfcFloat>::infinity();
    IfcFloat min_point[2] = {a,b}, min_diff[2] = {inf,inf};
    IfcFloat runner = a;

    for (unsigned int i = 0; i < samples; ++i, runner += delta) {
        const IfcFloat diff = (cv->Eval(runner)-val).SquareLength();
        if (diff < min_diff[0]) {
            min_diff[1] = min_diff[0];
            min_point[1] = min_point[0];

            min_diff[0] = diff;
            min_point[0] = runner;
        }
        else if (diff < min_diff[1]) {
            min_diff[1] = diff;
            min_point[1] = runner;
        }
    }

    ai_assert( min_diff[ 0 ] != inf );
    ai_assert( min_diff[ 1 ] != inf );
    if ( std::fabs(a-min_point[0]) < threshold || recurse >= max_recurse) {
        return min_point[0];
    }

    // fix for closed curves to take their wrap-over into account
    if (cv->IsClosed() && std::fabs(min_point[0]-min_point[1]) > cv->GetParametricRangeDelta()*0.5  ) {
        const Curve::ParamRange& range = cv->GetParametricRange();
        const IfcFloat wrapdiff = (cv->Eval(range.first)-val).SquareLength();

        if (wrapdiff < min_diff[0]) {
            const IfcFloat t = min_point[0];
            min_point[0] = min_point[1] > min_point[0] ? range.first : range.second;
             min_point[1] = t;
        }
    }

    return RecursiveSearch(cv,val,min_point[0],min_point[1],samples,threshold,recurse+1,max_recurse);
}